

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

char * flag_string(flag_type *flag_table,long *bits)

{
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  long in_RSI;
  flag_type *in_RDI;
  __type_conflict2 _Var4;
  int flag;
  long in_stack_ffffffffffffffc8;
  ulong in_stack_ffffffffffffffd0;
  int local_14;
  
  flag_string::buf[0] = '\0';
  local_14 = 0;
  do {
    if (in_RDI[local_14].name == (char *)0x0) {
LAB_00791401:
      pcVar2 = " none";
      if (flag_string::buf[0] != '\0') {
        pcVar2 = flag_string::buf;
      }
      return pcVar2 + 1;
    }
    bVar3 = is_stat(in_RDI);
    if ((bVar3) ||
       (uVar1 = *(ulong *)(in_RSI + (long)(int)(in_RDI[local_14].bit / 0x20) * 8),
       _Var4 = std::pow<int,long>((int)(in_stack_ffffffffffffffd0 >> 0x20),in_stack_ffffffffffffffc8
                                 ), (uVar1 & (long)_Var4) == 0)) {
      in_stack_ffffffffffffffd0 = *(ulong *)(in_RSI + (long)(int)(in_RDI[local_14].bit / 0x20) * 8);
      in_stack_ffffffffffffffc8 = in_RSI;
      _Var4 = std::pow<int,long>((int)(in_stack_ffffffffffffffd0 >> 0x20),in_RSI);
      if ((in_stack_ffffffffffffffd0 & (long)_Var4) != 0) {
        strcat(flag_string::buf," ");
        strcat(flag_string::buf,in_RDI[local_14].name);
        goto LAB_00791401;
      }
    }
    else {
      strcat(flag_string::buf," ");
      strcat(flag_string::buf,in_RDI[local_14].name);
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

char *flag_string(const struct flag_type *flag_table, long bits[])
{
	static char buf[512];
	int flag;

	buf[0] = '\0';

	for (flag = 0; flag_table[flag].name != nullptr; flag++)
	{
		if (!is_stat(flag_table) && IS_SET(bits, flag_table[flag].bit))
		{
			strcat(buf, " ");
			strcat(buf, flag_table[flag].name);
		}
		else if (IS_SET(bits, flag_table[flag].bit))
		{
			strcat(buf, " ");
			strcat(buf, flag_table[flag].name);
			break;
		}
	}

	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}